

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::ExceedingBoundariesTest::ExceedingBoundariesTest
          (ExceedingBoundariesTest *this,Context *context)

{
  GLuint GVar1;
  bool bVar2;
  undefined1 local_94 [8];
  testCase dst_test_case;
  testCase src_test_case;
  GLuint depth;
  GLenum res;
  GLuint z_val;
  GLuint y_val;
  GLuint x_val;
  GLuint z;
  GLuint y;
  GLuint x;
  GLuint height;
  GLenum tex_target;
  GLuint target;
  Context *context_local;
  ExceedingBoundariesTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"exceeding_boundaries",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for regions exceeding image boundaries"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ExceedingBoundariesTest_0322e7a0;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (height = 0; height < 0xb; height = height + 1) {
    GVar1 = *(GLuint *)(s_valid_targets + (ulong)height * 4);
    y = 4;
    if (GVar1 != 0x8c2a) {
      if ((GVar1 == 0xde0) || (GVar1 == 0x8c18)) {
        y = 1;
      }
      for (z = 0; z < 2; z = z + 1) {
        for (x_val = 0; x_val < 2; x_val = x_val + 1) {
          for (y_val = 0; y_val < 2; y_val = y_val + 1) {
            dst_test_case.m_src_y = ExceedingBoundariesTest::x_vals[z];
            dst_test_case.m_src_z = ExceedingBoundariesTest::y_vals[x_val];
            dst_test_case.m_dst_x = ExceedingBoundariesTest::z_vals[y_val];
            bVar2 = false;
            if ((dst_test_case.m_src_y == 0) && (bVar2 = false, dst_test_case.m_src_z == 0)) {
              bVar2 = dst_test_case.m_dst_x == 0;
            }
            dst_test_case.m_dst_y = 0x501;
            if (bVar2) {
              dst_test_case.m_dst_y = 0;
            }
            if (dst_test_case.m_dst_x == 0) {
              dst_test_case.m_expected_result = 1;
              local_94._4_4_ = 1;
              dst_test_case.m_tex_target = y;
              dst_test_case.m_depth = 0;
              dst_test_case.m_height = 0;
              dst_test_case.m_src_x = 0;
              local_94._0_4_ = GVar1;
              dst_test_case.m_dst_z = GVar1;
              std::
              vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
              ::push_back(&this->m_test_cases,(value_type *)&dst_test_case.m_dst_z);
              std::
              vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
              ::push_back(&this->m_test_cases,(value_type *)local_94);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

ExceedingBoundariesTest::ExceedingBoundariesTest(deqp::Context& context)
	: TestCase(context, "exceeding_boundaries", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
												"executed for regions exceeding image boundaries")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* 16x16x6 are values used by prepareTex16x16x6 */
	static const GLuint invalid_x = 16 - (m_region_width / 2);
	static const GLuint invalid_y = 16 - (m_region_height / 2);
	static const GLuint invalid_z = 6 - (m_region_depth / 2);

	static const GLuint x_vals[] = { 0, invalid_x };
	static const GLuint y_vals[] = { 0, invalid_y };
	static const GLuint z_vals[] = { 0, invalid_z };

	static const GLuint n_x_vals = sizeof(x_vals) / sizeof(x_vals[0]);
	static const GLuint n_y_vals = sizeof(y_vals) / sizeof(y_vals[0]);
	static const GLuint n_z_vals = sizeof(z_vals) / sizeof(z_vals[0]);

	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		GLuint		 height		= m_region_height;

		if (GL_TEXTURE_BUFFER == tex_target)
		{
			continue;
		}

		if ((GL_TEXTURE_1D == tex_target) || (GL_TEXTURE_1D_ARRAY == tex_target))
		{
			height = 1;
		}

		for (GLuint x = 0; x < n_x_vals; ++x)
		{
			for (GLuint y = 0; y < n_y_vals; ++y)
			{
				for (GLuint z = 0; z < n_z_vals; ++z)
				{
					const GLuint x_val = x_vals[x];
					const GLuint y_val = y_vals[y];
					const GLuint z_val = z_vals[z];
					const GLenum res = ((0 == x_val) && (0 == y_val) && (0 == z_val)) ? GL_NO_ERROR : GL_INVALID_VALUE;
					GLuint		 depth = 1;

					if (0 != z_val)
					{
						if ((GL_TEXTURE_2D_ARRAY != tex_target) || (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != tex_target) ||
							(GL_TEXTURE_3D != tex_target) || (GL_TEXTURE_CUBE_MAP_ARRAY != tex_target))
						{
							/* Skip z != 0 for 2d textures */
							continue;
						}
						else
						{
							/* Set depth so as to exceed boundary */
							depth = m_region_depth;
						}
					}

					testCase src_test_case = { tex_target, depth, height, x_val, y_val, z_val, 0, 0, 0, res };

					testCase dst_test_case = { tex_target, depth, height, 0, 0, 0, x_val, y_val, z_val, res };

					m_test_cases.push_back(src_test_case);
					m_test_cases.push_back(dst_test_case);
				}
			}
		}
	}
}